

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O0

void __thiscall
parlay::scheduler<parlay::WorkStealingJob>::worker(scheduler<parlay::WorkStealingJob> *this)

{
  bool bVar1;
  scheduler<parlay::WorkStealingJob> *in_RDI;
  WorkStealingJob *job;
  WorkStealingJob *in_stack_ffffffffffffffb0;
  scheduler<parlay::WorkStealingJob> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  wait_for_work((scheduler<parlay::WorkStealingJob> *)
                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  while (bVar1 = finished(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffc8 =
         (scheduler<parlay::WorkStealingJob> *)
         get_job<parlay::scheduler<parlay::WorkStealingJob>::worker()::_lambda()_1_>
                   (in_stack_ffffffffffffffc8,(anon_class_8_1_8991fb9c *)in_RDI,
                    SUB81((ulong)in_RDI >> 0x38,0));
    if (in_stack_ffffffffffffffc8 == (scheduler<parlay::WorkStealingJob> *)0x0) {
      bVar1 = finished(in_RDI);
      if (!bVar1) {
        wait_for_work((scheduler<parlay::WorkStealingJob> *)
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      }
    }
    else {
      WorkStealingJob::operator()(in_stack_ffffffffffffffb0);
    }
  }
  LOCK();
  (in_RDI->num_finished_workers).super___atomic_base<unsigned_long>._M_i =
       (in_RDI->num_finished_workers).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void worker() {
#if PARLAY_ELASTIC_PARALLELISM
    wait_for_work();
#endif
    while (!finished()) {
      Job* job = get_job([&]() { return finished(); }, PARLAY_ELASTIC_PARALLELISM);
      if (job)(*job)();
#if PARLAY_ELASTIC_PARALLELISM
      else if (!finished()) {
        // If no job was stolen, the worker should go to
        // sleep and wait until more work is available
        wait_for_work();
      }
#endif
    }
    assert(finished());
    num_finished_workers.fetch_add(1);
  }